

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

bool __thiscall r_comp::Preprocessor::isSet(Preprocessor *this,string *className)

{
  element_type *peVar1;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  __type _Var4;
  __type _Var5;
  undefined8 in_RCX;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  byte bVar7;
  Ptr replistruct;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_68;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar1 = (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = &((peVar1->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = *(__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(peVar1->args).
                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  local_58 = className;
  do {
    bVar7 = (byte)in_RCX;
    if (p_Var6 == p_Var2) {
LAB_0014106a:
      return (bool)(p_Var6 != p_Var2 & bVar7);
    }
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,p_Var6);
    if ((local_68._M_ptr)->type == Directive) {
      bVar3 = std::operator!=(&(local_68._M_ptr)->cmd,"!class");
      if (!bVar3) {
        _Var4 = std::operator==(&(local_68._M_ptr)->cmd,local_58);
        peVar1 = local_68._M_ptr;
        if (!_Var4) {
          std::operator+(&local_50,local_58,"[]");
          _Var5 = std::operator==(&peVar1->cmd,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (!_Var5) goto LAB_00141045;
        }
        bVar7 = !_Var4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        goto LAB_0014106a;
      }
    }
LAB_00141045:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    p_Var6 = p_Var6 + 1;
  } while( true );
}

Assistant:

bool Preprocessor::isSet(std::string className)
{
    for(RepliStruct::Ptr replistruct : root->args) {
        if (replistruct->type != RepliStruct::Directive || replistruct->cmd != "!class") {
            continue;
        }

        if (replistruct->cmd == className) { // set classes are written class_name[].
            return false;
        }

        if (replistruct->cmd == className + "[]") {
            return true;
        }
    }

    return false;
}